

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O2

void anon_unknown.dwarf_87756::append_rewrite_rule(RewriteRules *r,char *str)

{
  size_t sVar1;
  ostream *poVar2;
  string tmp;
  char *col [3];
  
  sVar1 = MeCab::tokenize2<char**>(str," \t",col,3);
  if (sVar1 < 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                            );
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x19);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"n >= 2");
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,"format error: ");
    std::operator<<(poVar2,str);
    MeCab::die::~die((die *)&tmp);
  }
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::resize
            (&r->super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>,
             ((long)(r->super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>)
                    .
                    super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(r->super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>).
                   super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x30 + 1);
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  if (2 < sVar1) {
    std::__cxx11::string::assign((char *)&tmp);
    std::__cxx11::string::push_back((char)&tmp);
    std::__cxx11::string::append((char *)&tmp);
    col[1] = tmp._M_dataplus._M_p;
  }
  MeCab::RewritePattern::set_pattern
            ((r->super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>).
             super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1,col[0],col[1]);
  std::__cxx11::string::~string((string *)&tmp);
  return;
}

Assistant:

void append_rewrite_rule(RewriteRules *r, char* str) {
  char *col[3];
  const size_t n = tokenize2(str, " \t", col, 3);
  CHECK_DIE(n >= 2) << "format error: " << str;
  r->resize(r->size() + 1);
  std::string tmp;
  if (n >= 3) {
    tmp = col[1];
    tmp += ' ';
    tmp += col[2];
    col[1] = const_cast<char *>(tmp.c_str());
  }
  r->back().set_pattern(col[0], col[1]);
}